

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

string * __thiscall
cpsm::Matcher<cpsm::NonPathTraits,cpsm::SimpleStringTraits>::score_debug_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Matcher<cpsm::NonPathTraits,cpsm::SimpleStringTraits> *this)

{
  unsigned_long in_stack_ffffffffffffffc0;
  
  str_cat<char_const*,unsigned_long,char_const*,bool,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (__return_storage_ptr__,(cpsm *)"prefix_level = ",(char *)(long)*(int *)(this + 0x60),
             0x1383e4,(char *)(ulong)(byte)this[100],true,*(char **)(this + 0x68),0x13841d,
             *(char **)(this + 0x70),0x138437,*(char **)(this + 0x78),0x13844f,
             *(char **)(this + 0x80),0x138471,*(char **)(this + 0x88),0x13848b,
             *(char **)(this + 0x90),0x1384a5,(char *)(*(long *)(this + 0x10) - *(long *)(this + 8))
             ,in_stack_ffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

std::string score_debug_string() const final {
    return str_cat("prefix_level = ", Score(prefix_level_),
                   ", whole_basename_match = ", whole_basename_match_,
                   ", basename_longest_submatch = ", basename_longest_submatch_,
                   ", basename_match_count = ", basename_match_count_,
                   ", basename_word_gaps = ", basename_word_gaps_,
                   ", crfile_basename_shared_words = ",
                   crfile_basename_shared_words_, ", crfile_path_distance = ",
                   crfile_path_distance_, ", unmatched_suffix_len = ",
                   unmatched_suffix_len_, ", item_len = ", item_.size());
  }